

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  BYTE *iEnd;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  BYTE *pBVar7;
  ZSTD_matchState_t *pZVar8;
  BYTE *mEnd;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  char cVar15;
  U32 UVar16;
  uint uVar17;
  long *plVar18;
  ulong uVar19;
  BYTE *pBVar20;
  ulong uVar21;
  size_t sVar22;
  long *plVar23;
  seqDef *psVar24;
  byte bVar25;
  byte bVar26;
  BYTE *pBVar27;
  long lVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  U32 UVar34;
  long *plVar35;
  long *plVar36;
  uint uVar37;
  BYTE *iStart;
  ulong uVar38;
  BYTE *pBVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  int iVar46;
  int *piVar47;
  U32 local_f0;
  U32 local_ec;
  BYTE *iend;
  U32 dictIndexDelta;
  BYTE *litLimit_w;
  U32 stepSize;
  BYTE *litLimit_w_4;
  char *_ptr;
  BYTE *base;
  
  uVar3 = (ms->cParams).targetLength;
  uVar31 = (ulong)(uVar3 + (uVar3 == 0));
  pBVar7 = (ms->window).base;
  uVar3 = (ms->window).dictLimit;
  iStart = pBVar7 + uVar3;
  iEnd = (BYTE *)((long)src + srcSize);
  plVar18 = (long *)((long)src + (srcSize - 8));
  pZVar8 = ms->dictMatchState;
  uVar4 = (pZVar8->window).dictLimit;
  mEnd = (pZVar8->window).nextSrc;
  pBVar9 = (pZVar8->window).base;
  pBVar39 = pBVar9 + uVar4;
  uVar33 = ((int)pBVar9 - (int)mEnd) + uVar3;
  iVar12 = ((int)src - (int)iStart) + (int)mEnd;
  iVar13 = (int)pBVar39;
  pUVar10 = pZVar8->hashTable;
  uVar17 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  iVar5 = ms->prefetchCDictTables;
  local_f0 = *rep;
  local_ec = rep[1];
  uVar19 = (ulong)uVar33;
  bVar25 = (byte)(pZVar8->cParams).hashLog;
  iVar46 = (int)pBVar7;
  cVar15 = (char)(ms->cParams).hashLog;
  if (uVar17 == 5) {
    if (iVar5 != 0) {
      for (uVar40 = 0; uVar40 < (ulong)(4L << (bVar25 & 0x3f)); uVar40 = uVar40 + 0x40) {
      }
    }
    plVar35 = (long *)((long)src + (ulong)(iVar12 == iVar13));
    bVar26 = 0x40 - cVar15;
    plVar1 = (long *)(iEnd + -0x20);
LAB_003cde03:
    if ((long *)((long)src + uVar31) <= plVar18) {
      uVar21 = *plVar35 * -0x30e4432345000000;
      uVar45 = uVar21 >> (0x38 - bVar25 & 0x3f);
      uVar41 = (ulong)pUVar10[uVar45 >> 8];
      uVar45 = uVar45 ^ uVar41;
      plVar23 = plVar35 + 0x20;
      plVar36 = plVar35;
      plVar35 = (long *)((long)src + uVar31);
      uVar40 = uVar31;
LAB_003cde54:
      uVar38 = uVar21 >> (bVar26 & 0x3f);
      uVar17 = pUVar11[uVar38];
      UVar34 = (U32)((long)plVar36 - (long)pBVar7);
      uVar29 = (UVar34 - local_f0) + 1;
      uVar21 = *plVar35 * -0x30e4432345000000;
      uVar43 = uVar21 >> (0x38 - bVar25 & 0x3f);
      pUVar11[uVar38] = UVar34;
      if ((uVar3 - 1) - uVar29 < 3) {
LAB_003cdece:
        if ((char)uVar45 == '\0') {
          uVar45 = uVar41 >> 8;
          uVar29 = (uint)(uVar41 >> 8);
          if (((uVar29 <= uVar4) || (*(int *)(pBVar9 + uVar45) != (int)*plVar36)) ||
             (uVar3 < uVar17)) goto LAB_003cdefa;
          UVar16 = UVar34 - (uVar29 + uVar33);
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar36 + 4),pBVar9 + uVar45 + 4,iEnd,mEnd,iStart);
          for (lVar32 = 0;
              ((plVar35 = (long *)(lVar32 + (long)plVar36), pBVar39 < pBVar9 + lVar32 + uVar45 &&
               (src < plVar35)) &&
              (*(BYTE *)((long)plVar36 + lVar32 + -1) == pBVar9[lVar32 + (uVar45 - 1)]));
              lVar32 = lVar32 + -1) {
          }
          uVar40 = (long)plVar35 - (long)src;
          plVar23 = (long *)seqStore->lit;
          if (plVar1 < plVar35) {
            ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
LAB_003ce1fb:
            seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
            psVar24 = seqStore->sequences;
            if (0xffff < uVar40) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar23 = *src;
            plVar23[1] = lVar28;
            pBVar20 = seqStore->lit;
            if (0x10 < uVar40) {
              lVar28 = *(long *)((long)src + 0x18);
              *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar20 + 0x18) = lVar28;
              if (0x20 < (long)uVar40) {
                lVar28 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar14 = puVar2[1];
                  pBVar27 = pBVar20 + lVar28 + 0x20;
                  *(undefined8 *)pBVar27 = *puVar2;
                  *(undefined8 *)(pBVar27 + 8) = uVar14;
                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar14 = puVar2[1];
                  *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
              }
              goto LAB_003ce1fb;
            }
            seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
            psVar24 = seqStore->sequences;
          }
          lVar28 = (sVar22 - lVar32) + 4;
          psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
          psVar24->offBase = UVar16 + 3;
          uVar40 = (sVar22 - lVar32) + 1;
          local_ec = local_f0;
          local_f0 = UVar16;
          goto LAB_003ce341;
        }
LAB_003cdefa:
        if ((uVar17 <= uVar3) || (piVar47 = (int *)(pBVar7 + uVar17), *piVar47 != (int)*plVar36)) {
          uVar40 = (uVar40 + 1) - (ulong)(plVar35 < plVar23);
          if ((long *)((long)plVar35 + uVar40) <= plVar18) goto code_r0x003cdf26;
          goto LAB_003cf3a6;
        }
        UVar16 = (int)plVar36 - (int)piVar47;
        sVar22 = ZSTD_count((BYTE *)((long)plVar36 + 4),(BYTE *)(piVar47 + 1),iEnd);
        for (lVar32 = 0;
            ((plVar35 = (long *)(lVar32 + (long)plVar36), iStart < (BYTE *)((long)piVar47 + lVar32)
             && (src < plVar35)) &&
            (*(BYTE *)((long)plVar36 + lVar32 + -1) == *(BYTE *)((long)piVar47 + lVar32 + -1)));
            lVar32 = lVar32 + -1) {
        }
        uVar40 = (long)plVar35 - (long)src;
        plVar23 = (long *)seqStore->lit;
        if (plVar1 < plVar35) {
          ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
LAB_003ce062:
          seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
          psVar24 = seqStore->sequences;
          if (0xffff < uVar40) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar28 = *(long *)((long)src + 8);
          *plVar23 = *src;
          plVar23[1] = lVar28;
          pBVar20 = seqStore->lit;
          if (0x10 < uVar40) {
            lVar28 = *(long *)((long)src + 0x18);
            *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar20 + 0x18) = lVar28;
            if (0x20 < (long)uVar40) {
              lVar28 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                uVar14 = puVar2[1];
                pBVar27 = pBVar20 + lVar28 + 0x20;
                *(undefined8 *)pBVar27 = *puVar2;
                *(undefined8 *)(pBVar27 + 8) = uVar14;
                puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                uVar14 = puVar2[1];
                *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                lVar28 = lVar28 + 0x20;
              } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
            }
            goto LAB_003ce062;
          }
          seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
          psVar24 = seqStore->sequences;
        }
        lVar28 = (sVar22 - lVar32) + 4;
        psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
        psVar24->offBase = UVar16 + 3;
        uVar40 = (sVar22 - lVar32) + 1;
        local_ec = local_f0;
        local_f0 = UVar16;
      }
      else {
        piVar47 = (int *)(pBVar7 + uVar29);
        if (uVar29 < uVar3) {
          piVar47 = (int *)(pBVar9 + (uVar29 - uVar33));
        }
        if (*piVar47 != *(int *)((long)plVar36 + 1)) goto LAB_003cdece;
        plVar35 = (long *)((long)plVar36 + 1);
        pBVar20 = iEnd;
        if (uVar29 < uVar3) {
          pBVar20 = mEnd;
        }
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar36 + 5),(BYTE *)(piVar47 + 1),iEnd,pBVar20,iStart);
        uVar40 = (long)plVar35 - (long)src;
        plVar23 = (long *)seqStore->lit;
        if (plVar1 < plVar35) {
          ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
          goto LAB_003cdfb3;
        }
        lVar32 = *(long *)((long)src + 8);
        *plVar23 = *src;
        plVar23[1] = lVar32;
        pBVar20 = seqStore->lit;
        if (uVar40 < 0x11) {
          seqStore->lit = pBVar20 + uVar40;
          psVar24 = seqStore->sequences;
        }
        else {
          lVar32 = *(long *)((long)src + 0x18);
          *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar20 + 0x18) = lVar32;
          if (0x20 < (long)uVar40) {
            lVar32 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar32 + 0x20);
              uVar14 = puVar2[1];
              pBVar27 = pBVar20 + lVar32 + 0x20;
              *(undefined8 *)pBVar27 = *puVar2;
              *(undefined8 *)(pBVar27 + 8) = uVar14;
              puVar2 = (undefined8 *)((long)src + lVar32 + 0x30);
              uVar14 = puVar2[1];
              *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar27 + 0x18) = uVar14;
              lVar32 = lVar32 + 0x20;
            } while (pBVar27 + 0x20 < pBVar20 + uVar40);
          }
LAB_003cdfb3:
          seqStore->lit = seqStore->lit + uVar40;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar40) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        lVar28 = sVar22 + 4;
        psVar24->litLength = (U16)uVar40;
        psVar24->offBase = 1;
        uVar40 = sVar22 + 1;
      }
LAB_003ce341:
      if (0xffff < uVar40) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
      plVar35 = (long *)(lVar28 + (long)plVar35);
      psVar24->mlBase = (U16)uVar40;
      seqStore->sequences = psVar24 + 1;
      src = plVar35;
      if (plVar35 <= plVar18) {
        pUVar11[(ulong)(*(long *)(pBVar7 + ((long)plVar36 - (long)pBVar7 & 0xffffffffU) + 2) *
                       -0x30e4432345000000) >> (bVar26 & 0x3f)] = UVar34 + 2;
        pUVar11[(ulong)(*(long *)((long)plVar35 + -2) * -0x30e4432345000000) >> (bVar26 & 0x3f)] =
             ((int)plVar35 + -2) - iVar46;
        UVar34 = local_ec;
        for (; local_ec = UVar34, src = plVar35, plVar35 <= plVar18;
            plVar35 = (long *)((long)plVar35 + sVar22 + 4)) {
          UVar34 = (int)plVar35 - iVar46;
          uVar17 = UVar34 - local_ec;
          pBVar20 = pBVar7;
          if (uVar17 < uVar3) {
            pBVar20 = pBVar9 + -uVar19;
          }
          if (((uVar3 - 1) - uVar17 < 3) || (*(int *)(pBVar20 + uVar17) != (int)*plVar35)) break;
          pBVar27 = iEnd;
          if (uVar17 < uVar3) {
            pBVar27 = mEnd;
          }
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar35 + 4),(BYTE *)((long)(pBVar20 + uVar17) + 4),
                              iEnd,pBVar27,iStart);
          plVar23 = (long *)seqStore->lit;
          if (plVar1 < plVar35) {
            ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar35,(BYTE *)plVar35,(BYTE *)plVar1);
          }
          else {
            lVar32 = plVar35[1];
            *plVar23 = *plVar35;
            plVar23[1] = lVar32;
          }
          psVar24 = seqStore->sequences;
          psVar24->litLength = 0;
          psVar24->offBase = 1;
          if (0xffff < sVar22 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar24->mlBase = (U16)(sVar22 + 1);
          seqStore->sequences = psVar24 + 1;
          pUVar11[(ulong)(*plVar35 * -0x30e4432345000000) >> (bVar26 & 0x3f)] = UVar34;
          UVar34 = local_f0;
          local_f0 = local_ec;
        }
      }
      goto LAB_003cde03;
    }
  }
  else {
    if (uVar17 == 6) {
      if (iVar5 != 0) {
        for (uVar40 = 0; uVar40 < (ulong)(4L << (bVar25 & 0x3f)); uVar40 = uVar40 + 0x40) {
        }
      }
      plVar35 = (long *)((long)src + (ulong)(iVar12 == iVar13));
      bVar26 = 0x40 - cVar15;
      plVar1 = (long *)(iEnd + -0x20);
LAB_003cd74b:
      if ((long *)((long)src + uVar31) <= plVar18) {
        uVar21 = *plVar35 * -0x30e4432340650000;
        uVar45 = uVar21 >> (0x38 - bVar25 & 0x3f);
        uVar41 = (ulong)pUVar10[uVar45 >> 8];
        uVar45 = uVar45 ^ uVar41;
        plVar23 = plVar35 + 0x20;
        plVar36 = plVar35;
        plVar35 = (long *)((long)src + uVar31);
        uVar40 = uVar31;
LAB_003cd797:
        uVar38 = uVar21 >> (bVar26 & 0x3f);
        uVar17 = pUVar11[uVar38];
        UVar34 = (U32)((long)plVar36 - (long)pBVar7);
        uVar29 = (UVar34 - local_f0) + 1;
        uVar21 = *plVar35 * -0x30e4432340650000;
        uVar43 = uVar21 >> (0x38 - bVar25 & 0x3f);
        pUVar11[uVar38] = UVar34;
        if ((uVar3 - 1) - uVar29 < 3) {
LAB_003cd80c:
          if ((char)uVar45 == '\0') {
            uVar45 = uVar41 >> 8;
            uVar29 = (uint)(uVar41 >> 8);
            if (((uVar29 <= uVar4) || (*(int *)(pBVar9 + uVar45) != (int)*plVar36)) ||
               (uVar3 < uVar17)) goto LAB_003cd838;
            UVar16 = UVar34 - (uVar29 + uVar33);
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar36 + 4),pBVar9 + uVar45 + 4,iEnd,mEnd,iStart);
            for (lVar32 = 0;
                ((plVar35 = (long *)(lVar32 + (long)plVar36), pBVar39 < pBVar9 + lVar32 + uVar45 &&
                 (src < plVar35)) &&
                (*(BYTE *)((long)plVar36 + lVar32 + -1) == pBVar9[lVar32 + (uVar45 - 1)]));
                lVar32 = lVar32 + -1) {
            }
            uVar40 = (long)plVar35 - (long)src;
            plVar23 = (long *)seqStore->lit;
            if (plVar1 < plVar35) goto LAB_003cdad0;
            lVar28 = *(long *)((long)src + 8);
            *plVar23 = *src;
            plVar23[1] = lVar28;
            pBVar20 = seqStore->lit;
            if (uVar40 < 0x11) goto LAB_003cdb96;
            lVar28 = *(long *)((long)src + 0x18);
            *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar20 + 0x18) = lVar28;
            if (0x20 < (long)uVar40) {
              lVar28 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                uVar14 = puVar2[1];
                pBVar27 = pBVar20 + lVar28 + 0x20;
                *(undefined8 *)pBVar27 = *puVar2;
                *(undefined8 *)(pBVar27 + 8) = uVar14;
                puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                uVar14 = puVar2[1];
                *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                lVar28 = lVar28 + 0x20;
              } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
            }
            goto LAB_003cdadd;
          }
LAB_003cd838:
          if ((uVar3 < uVar17) && (piVar47 = (int *)(pBVar7 + uVar17), *piVar47 == (int)*plVar36))
          goto LAB_003cd924;
          uVar40 = (uVar40 + 1) - (ulong)(plVar35 < plVar23);
          if (plVar18 < (long *)((long)plVar35 + uVar40)) goto LAB_003cf3a6;
          plVar23 = plVar23 + (ulong)(plVar23 <= plVar35) * 0x20;
          uVar41 = (ulong)pUVar10[uVar43 >> 8];
          uVar45 = uVar43 ^ uVar41;
          plVar36 = plVar35;
          plVar35 = (long *)((long)plVar35 + uVar40);
          goto LAB_003cd797;
        }
        piVar47 = (int *)(pBVar7 + uVar29);
        if (uVar29 < uVar3) {
          piVar47 = (int *)(pBVar9 + (uVar29 - uVar33));
        }
        if (*piVar47 != *(int *)((long)plVar36 + 1)) goto LAB_003cd80c;
        plVar35 = (long *)((long)plVar36 + 1);
        pBVar20 = iEnd;
        if (uVar29 < uVar3) {
          pBVar20 = mEnd;
        }
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar36 + 5),(BYTE *)(piVar47 + 1),iEnd,pBVar20,iStart);
        uVar40 = (long)plVar35 - (long)src;
        plVar23 = (long *)seqStore->lit;
        if (plVar1 < plVar35) {
          ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
          goto LAB_003cd8f1;
        }
        lVar32 = *(long *)((long)src + 8);
        *plVar23 = *src;
        plVar23[1] = lVar32;
        pBVar20 = seqStore->lit;
        if (uVar40 < 0x11) {
          seqStore->lit = pBVar20 + uVar40;
          psVar24 = seqStore->sequences;
        }
        else {
          lVar32 = *(long *)((long)src + 0x18);
          *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
          *(long *)(pBVar20 + 0x18) = lVar32;
          if (0x20 < (long)uVar40) {
            lVar32 = 0;
            do {
              puVar2 = (undefined8 *)((long)src + lVar32 + 0x20);
              uVar14 = puVar2[1];
              pBVar27 = pBVar20 + lVar32 + 0x20;
              *(undefined8 *)pBVar27 = *puVar2;
              *(undefined8 *)(pBVar27 + 8) = uVar14;
              puVar2 = (undefined8 *)((long)src + lVar32 + 0x30);
              uVar14 = puVar2[1];
              *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar27 + 0x18) = uVar14;
              lVar32 = lVar32 + 0x20;
            } while (pBVar27 + 0x20 < pBVar20 + uVar40);
          }
LAB_003cd8f1:
          seqStore->lit = seqStore->lit + uVar40;
          psVar24 = seqStore->sequences;
          if (0xffff < uVar40) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        psVar24->litLength = (U16)uVar40;
        psVar24->offBase = 1;
        goto LAB_003cdbd7;
      }
      goto LAB_003cf3a6;
    }
    if (uVar17 == 7) {
      if (iVar5 != 0) {
        for (uVar40 = 0; uVar40 < (ulong)(4L << (bVar25 & 0x3f)); uVar40 = uVar40 + 0x40) {
        }
      }
      plVar35 = (long *)((long)src + (ulong)(iVar12 == iVar13));
      bVar26 = 0x40 - cVar15;
      plVar1 = (long *)(iEnd + -0x20);
LAB_003ce588:
      if ((long *)((long)src + uVar31) <= plVar18) {
        uVar21 = *plVar35 * -0x30e44323405a9d00;
        uVar45 = uVar21 >> (0x38 - bVar25 & 0x3f);
        uVar41 = (ulong)pUVar10[uVar45 >> 8];
        uVar45 = uVar45 ^ uVar41;
        plVar23 = plVar35 + 0x20;
        plVar36 = plVar35;
        plVar35 = (long *)((long)src + uVar31);
        uVar40 = uVar31;
LAB_003ce5d4:
        uVar38 = uVar21 >> (bVar26 & 0x3f);
        uVar17 = pUVar11[uVar38];
        UVar34 = (U32)((long)plVar36 - (long)pBVar7);
        uVar29 = (UVar34 - local_f0) + 1;
        uVar21 = *plVar35 * -0x30e44323405a9d00;
        uVar43 = uVar21 >> (0x38 - bVar25 & 0x3f);
        pUVar11[uVar38] = UVar34;
        if ((uVar3 - 1) - uVar29 < 3) {
LAB_003ce649:
          if ((char)uVar45 == '\0') {
            uVar45 = uVar41 >> 8;
            uVar29 = (uint)(uVar41 >> 8);
            if (((uVar29 <= uVar4) || (*(int *)(pBVar9 + uVar45) != (int)*plVar36)) ||
               (uVar3 < uVar17)) goto LAB_003ce675;
            UVar16 = UVar34 - (uVar29 + uVar33);
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar36 + 4),pBVar9 + uVar45 + 4,iEnd,mEnd,iStart);
            for (lVar32 = 0;
                ((plVar35 = (long *)(lVar32 + (long)plVar36), pBVar39 < pBVar9 + lVar32 + uVar45 &&
                 (src < plVar35)) &&
                (*(BYTE *)((long)plVar36 + lVar32 + -1) == pBVar9[lVar32 + (uVar45 - 1)]));
                lVar32 = lVar32 + -1) {
            }
            uVar40 = (long)plVar35 - (long)src;
            plVar23 = (long *)seqStore->lit;
            if (plVar1 < plVar35) {
              ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
LAB_003ce976:
              seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
              psVar24 = seqStore->sequences;
              if (0xffff < uVar40) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              lVar28 = *(long *)((long)src + 8);
              *plVar23 = *src;
              plVar23[1] = lVar28;
              pBVar20 = seqStore->lit;
              if (0x10 < uVar40) {
                lVar28 = *(long *)((long)src + 0x18);
                *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar20 + 0x18) = lVar28;
                if (0x20 < (long)uVar40) {
                  lVar28 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                    uVar14 = puVar2[1];
                    pBVar27 = pBVar20 + lVar28 + 0x20;
                    *(undefined8 *)pBVar27 = *puVar2;
                    *(undefined8 *)(pBVar27 + 8) = uVar14;
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                    uVar14 = puVar2[1];
                    *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                    lVar28 = lVar28 + 0x20;
                  } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
                }
                goto LAB_003ce976;
              }
              seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
              psVar24 = seqStore->sequences;
            }
            lVar28 = (sVar22 - lVar32) + 4;
            psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
            psVar24->offBase = UVar16 + 3;
            uVar40 = (sVar22 - lVar32) + 1;
            local_ec = local_f0;
            local_f0 = UVar16;
            goto LAB_003ceabc;
          }
LAB_003ce675:
          if ((uVar17 <= uVar3) || (piVar47 = (int *)(pBVar7 + uVar17), *piVar47 != (int)*plVar36))
          {
            uVar40 = (uVar40 + 1) - (ulong)(plVar35 < plVar23);
            if ((long *)((long)plVar35 + uVar40) <= plVar18) goto code_r0x003ce6a1;
            goto LAB_003cf3a6;
          }
          UVar16 = (int)plVar36 - (int)piVar47;
          sVar22 = ZSTD_count((BYTE *)((long)plVar36 + 4),(BYTE *)(piVar47 + 1),iEnd);
          for (lVar32 = 0;
              ((plVar35 = (long *)(lVar32 + (long)plVar36),
               iStart < (BYTE *)((long)piVar47 + lVar32) && (src < plVar35)) &&
              (*(BYTE *)((long)plVar36 + lVar32 + -1) == *(BYTE *)((long)piVar47 + lVar32 + -1)));
              lVar32 = lVar32 + -1) {
          }
          uVar40 = (long)plVar35 - (long)src;
          plVar23 = (long *)seqStore->lit;
          if (plVar1 < plVar35) {
            ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
LAB_003ce7dd:
            seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
            psVar24 = seqStore->sequences;
            if (0xffff < uVar40) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar23 = *src;
            plVar23[1] = lVar28;
            pBVar20 = seqStore->lit;
            if (0x10 < uVar40) {
              lVar28 = *(long *)((long)src + 0x18);
              *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar20 + 0x18) = lVar28;
              if (0x20 < (long)uVar40) {
                lVar28 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar14 = puVar2[1];
                  pBVar27 = pBVar20 + lVar28 + 0x20;
                  *(undefined8 *)pBVar27 = *puVar2;
                  *(undefined8 *)(pBVar27 + 8) = uVar14;
                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar14 = puVar2[1];
                  *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
              }
              goto LAB_003ce7dd;
            }
            seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
            psVar24 = seqStore->sequences;
          }
          lVar28 = (sVar22 - lVar32) + 4;
          psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
          psVar24->offBase = UVar16 + 3;
          uVar40 = (sVar22 - lVar32) + 1;
          local_ec = local_f0;
          local_f0 = UVar16;
        }
        else {
          piVar47 = (int *)(pBVar7 + uVar29);
          if (uVar29 < uVar3) {
            piVar47 = (int *)(pBVar9 + (uVar29 - uVar33));
          }
          if (*piVar47 != *(int *)((long)plVar36 + 1)) goto LAB_003ce649;
          plVar35 = (long *)((long)plVar36 + 1);
          pBVar20 = iEnd;
          if (uVar29 < uVar3) {
            pBVar20 = mEnd;
          }
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar36 + 5),(BYTE *)(piVar47 + 1),iEnd,pBVar20,iStart)
          ;
          uVar40 = (long)plVar35 - (long)src;
          plVar23 = (long *)seqStore->lit;
          if (plVar1 < plVar35) {
            ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
            goto LAB_003ce72e;
          }
          lVar32 = *(long *)((long)src + 8);
          *plVar23 = *src;
          plVar23[1] = lVar32;
          pBVar20 = seqStore->lit;
          if (uVar40 < 0x11) {
            seqStore->lit = pBVar20 + uVar40;
            psVar24 = seqStore->sequences;
          }
          else {
            lVar32 = *(long *)((long)src + 0x18);
            *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar20 + 0x18) = lVar32;
            if (0x20 < (long)uVar40) {
              lVar32 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar32 + 0x20);
                uVar14 = puVar2[1];
                pBVar27 = pBVar20 + lVar32 + 0x20;
                *(undefined8 *)pBVar27 = *puVar2;
                *(undefined8 *)(pBVar27 + 8) = uVar14;
                puVar2 = (undefined8 *)((long)src + lVar32 + 0x30);
                uVar14 = puVar2[1];
                *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                lVar32 = lVar32 + 0x20;
              } while (pBVar27 + 0x20 < pBVar20 + uVar40);
            }
LAB_003ce72e:
            seqStore->lit = seqStore->lit + uVar40;
            psVar24 = seqStore->sequences;
            if (0xffff < uVar40) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          lVar28 = sVar22 + 4;
          psVar24->litLength = (U16)uVar40;
          psVar24->offBase = 1;
          uVar40 = sVar22 + 1;
        }
LAB_003ceabc:
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar35 = (long *)(lVar28 + (long)plVar35);
        psVar24->mlBase = (U16)uVar40;
        seqStore->sequences = psVar24 + 1;
        src = plVar35;
        if (plVar35 <= plVar18) {
          pUVar11[(ulong)(*(long *)(pBVar7 + ((long)plVar36 - (long)pBVar7 & 0xffffffffU) + 2) *
                         -0x30e44323405a9d00) >> (bVar26 & 0x3f)] = UVar34 + 2;
          pUVar11[(ulong)(*(long *)((long)plVar35 + -2) * -0x30e44323405a9d00) >> (bVar26 & 0x3f)] =
               ((int)plVar35 + -2) - iVar46;
          UVar34 = local_ec;
          for (; local_ec = UVar34, src = plVar35, plVar35 <= plVar18;
              plVar35 = (long *)((long)plVar35 + sVar22 + 4)) {
            UVar34 = (int)plVar35 - iVar46;
            uVar17 = UVar34 - local_ec;
            pBVar20 = pBVar7;
            if (uVar17 < uVar3) {
              pBVar20 = pBVar9 + -uVar19;
            }
            if (((uVar3 - 1) - uVar17 < 3) || (*(int *)(pBVar20 + uVar17) != (int)*plVar35)) break;
            pBVar27 = iEnd;
            if (uVar17 < uVar3) {
              pBVar27 = mEnd;
            }
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar35 + 4),(BYTE *)((long)(pBVar20 + uVar17) + 4),
                                iEnd,pBVar27,iStart);
            plVar23 = (long *)seqStore->lit;
            if (plVar1 < plVar35) {
              ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar35,(BYTE *)plVar35,(BYTE *)plVar1);
            }
            else {
              lVar32 = plVar35[1];
              *plVar23 = *plVar35;
              plVar23[1] = lVar32;
            }
            psVar24 = seqStore->sequences;
            psVar24->litLength = 0;
            psVar24->offBase = 1;
            if (0xffff < sVar22 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar24->mlBase = (U16)(sVar22 + 1);
            seqStore->sequences = psVar24 + 1;
            pUVar11[(ulong)(*plVar35 * -0x30e44323405a9d00) >> (bVar26 & 0x3f)] = UVar34;
            UVar34 = local_f0;
            local_f0 = local_ec;
          }
        }
        goto LAB_003ce588;
      }
    }
    else {
      if (iVar5 != 0) {
        for (uVar40 = 0; uVar40 < (ulong)(4L << (bVar25 & 0x3f)); uVar40 = uVar40 + 0x40) {
        }
      }
      plVar35 = (long *)((long)src + (ulong)(iVar12 == iVar13));
      bVar26 = 0x20 - cVar15;
      plVar1 = (long *)(iEnd + -0x20);
LAB_003cecc2:
      if ((long *)((long)src + uVar31) <= plVar18) {
        uVar29 = (int)*plVar35 * -0x61c8864f;
        uVar44 = uVar29 >> (0x18 - bVar25 & 0x1f);
        uVar17 = pUVar10[uVar44 >> 8];
        uVar44 = uVar44 ^ uVar17;
        plVar23 = plVar35 + 0x20;
        plVar36 = plVar35;
        plVar35 = (long *)((long)src + uVar31);
        uVar40 = uVar31;
LAB_003ced09:
        uVar37 = uVar29 >> (bVar26 & 0x1f);
        uVar6 = pUVar11[uVar37];
        UVar34 = (U32)((long)plVar36 - (long)pBVar7);
        uVar30 = (UVar34 - local_f0) + 1;
        uVar29 = (int)*plVar35 * -0x61c8864f;
        uVar42 = uVar29 >> (0x18 - bVar25 & 0x1f);
        pUVar11[uVar37] = UVar34;
        if ((uVar3 - 1) - uVar30 < 3) {
LAB_003ced75:
          if ((char)uVar44 == '\0') {
            uVar17 = uVar17 >> 8;
            uVar21 = (ulong)uVar17;
            if (((uVar17 <= uVar4) || (*(int *)(pBVar9 + uVar21) != (int)*plVar36)) ||
               (uVar3 < uVar6)) goto LAB_003ceda1;
            UVar16 = UVar34 - (uVar17 + uVar33);
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar36 + 4),pBVar9 + uVar21 + 4,iEnd,mEnd,iStart);
            for (lVar32 = 0;
                ((plVar35 = (long *)(lVar32 + (long)plVar36), pBVar39 < pBVar9 + lVar32 + uVar21 &&
                 (src < plVar35)) &&
                (*(BYTE *)((long)plVar36 + lVar32 + -1) == pBVar9[lVar32 + (uVar21 - 1)]));
                lVar32 = lVar32 + -1) {
            }
            uVar40 = (long)plVar35 - (long)src;
            plVar23 = (long *)seqStore->lit;
            if (plVar1 < plVar35) {
              ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
LAB_003cf0aa:
              seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
              psVar24 = seqStore->sequences;
              if (0xffff < uVar40) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
              }
            }
            else {
              lVar28 = *(long *)((long)src + 8);
              *plVar23 = *src;
              plVar23[1] = lVar28;
              pBVar20 = seqStore->lit;
              if (0x10 < uVar40) {
                lVar28 = *(long *)((long)src + 0x18);
                *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar20 + 0x18) = lVar28;
                if (0x20 < (long)uVar40) {
                  lVar28 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                    uVar14 = puVar2[1];
                    pBVar27 = pBVar20 + lVar28 + 0x20;
                    *(undefined8 *)pBVar27 = *puVar2;
                    *(undefined8 *)(pBVar27 + 8) = uVar14;
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                    uVar14 = puVar2[1];
                    *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                    lVar28 = lVar28 + 0x20;
                  } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
                }
                goto LAB_003cf0aa;
              }
              seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
              psVar24 = seqStore->sequences;
            }
            lVar28 = (sVar22 - lVar32) + 4;
            psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
            psVar24->offBase = UVar16 + 3;
            uVar40 = (sVar22 - lVar32) + 1;
            local_ec = local_f0;
            local_f0 = UVar16;
            goto LAB_003cf1f0;
          }
LAB_003ceda1:
          if ((uVar6 <= uVar3) || (piVar47 = (int *)(pBVar7 + uVar6), *piVar47 != (int)*plVar36)) {
            uVar40 = (uVar40 + 1) - (ulong)(plVar35 < plVar23);
            if ((long *)((long)plVar35 + uVar40) <= plVar18) goto code_r0x003cedcd;
            goto LAB_003cf3a6;
          }
          UVar16 = (int)plVar36 - (int)piVar47;
          sVar22 = ZSTD_count((BYTE *)((long)plVar36 + 4),(BYTE *)(piVar47 + 1),iEnd);
          for (lVar32 = 0;
              ((plVar35 = (long *)(lVar32 + (long)plVar36),
               iStart < (BYTE *)((long)piVar47 + lVar32) && (src < plVar35)) &&
              (*(BYTE *)((long)plVar36 + lVar32 + -1) == *(BYTE *)((long)piVar47 + lVar32 + -1)));
              lVar32 = lVar32 + -1) {
          }
          uVar40 = (long)plVar35 - (long)src;
          plVar23 = (long *)seqStore->lit;
          if (plVar1 < plVar35) {
            ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
LAB_003cef0e:
            seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
            psVar24 = seqStore->sequences;
            if (0xffff < uVar40) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar23 = *src;
            plVar23[1] = lVar28;
            pBVar20 = seqStore->lit;
            if (0x10 < uVar40) {
              lVar28 = *(long *)((long)src + 0x18);
              *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar20 + 0x18) = lVar28;
              if (0x20 < (long)uVar40) {
                lVar28 = 0;
                do {
                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                  uVar14 = puVar2[1];
                  pBVar27 = pBVar20 + lVar28 + 0x20;
                  *(undefined8 *)pBVar27 = *puVar2;
                  *(undefined8 *)(pBVar27 + 8) = uVar14;
                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                  uVar14 = puVar2[1];
                  *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                  *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                  lVar28 = lVar28 + 0x20;
                } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
              }
              goto LAB_003cef0e;
            }
            seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
            psVar24 = seqStore->sequences;
          }
          lVar28 = (sVar22 - lVar32) + 4;
          psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
          psVar24->offBase = UVar16 + 3;
          uVar40 = (sVar22 - lVar32) + 1;
          local_ec = local_f0;
          local_f0 = UVar16;
        }
        else {
          piVar47 = (int *)(pBVar7 + uVar30);
          if (uVar30 < uVar3) {
            piVar47 = (int *)(pBVar9 + (uVar30 - uVar33));
          }
          if (*piVar47 != *(int *)((long)plVar36 + 1)) goto LAB_003ced75;
          plVar35 = (long *)((long)plVar36 + 1);
          pBVar20 = iEnd;
          if (uVar30 < uVar3) {
            pBVar20 = mEnd;
          }
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar36 + 5),(BYTE *)(piVar47 + 1),iEnd,pBVar20,iStart)
          ;
          uVar40 = (long)plVar35 - (long)src;
          plVar23 = (long *)seqStore->lit;
          if (plVar1 < plVar35) {
            ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
            goto LAB_003cee5c;
          }
          lVar32 = *(long *)((long)src + 8);
          *plVar23 = *src;
          plVar23[1] = lVar32;
          pBVar20 = seqStore->lit;
          if (uVar40 < 0x11) {
            seqStore->lit = pBVar20 + uVar40;
            psVar24 = seqStore->sequences;
          }
          else {
            lVar32 = *(long *)((long)src + 0x18);
            *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar20 + 0x18) = lVar32;
            if (0x20 < (long)uVar40) {
              lVar32 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar32 + 0x20);
                uVar14 = puVar2[1];
                pBVar27 = pBVar20 + lVar32 + 0x20;
                *(undefined8 *)pBVar27 = *puVar2;
                *(undefined8 *)(pBVar27 + 8) = uVar14;
                puVar2 = (undefined8 *)((long)src + lVar32 + 0x30);
                uVar14 = puVar2[1];
                *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar27 + 0x18) = uVar14;
                lVar32 = lVar32 + 0x20;
              } while (pBVar27 + 0x20 < pBVar20 + uVar40);
            }
LAB_003cee5c:
            seqStore->lit = seqStore->lit + uVar40;
            psVar24 = seqStore->sequences;
            if (0xffff < uVar40) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          lVar28 = sVar22 + 4;
          psVar24->litLength = (U16)uVar40;
          psVar24->offBase = 1;
          uVar40 = sVar22 + 1;
        }
LAB_003cf1f0:
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar35 = (long *)(lVar28 + (long)plVar35);
        psVar24->mlBase = (U16)uVar40;
        seqStore->sequences = psVar24 + 1;
        src = plVar35;
        if (plVar35 <= plVar18) {
          pUVar11[(uint)(*(int *)(pBVar7 + ((long)plVar36 - (long)pBVar7 & 0xffffffffU) + 2) *
                        -0x61c8864f) >> (bVar26 & 0x1f)] = UVar34 + 2;
          pUVar11[(uint)(*(int *)((long)plVar35 + -2) * -0x61c8864f) >> (bVar26 & 0x1f)] =
               ((int)plVar35 + -2) - iVar46;
          UVar34 = local_ec;
          for (; local_ec = UVar34, src = plVar35, plVar35 <= plVar18;
              plVar35 = (long *)((long)plVar35 + sVar22 + 4)) {
            UVar34 = (int)plVar35 - iVar46;
            uVar17 = UVar34 - local_ec;
            pBVar20 = pBVar7;
            if (uVar17 < uVar3) {
              pBVar20 = pBVar9 + -uVar19;
            }
            if (((uVar3 - 1) - uVar17 < 3) || (*(int *)(pBVar20 + uVar17) != (int)*plVar35)) break;
            pBVar27 = iEnd;
            if (uVar17 < uVar3) {
              pBVar27 = mEnd;
            }
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar35 + 4),(BYTE *)((long)(pBVar20 + uVar17) + 4),
                                iEnd,pBVar27,iStart);
            plVar23 = (long *)seqStore->lit;
            if (plVar1 < plVar35) {
              ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar35,(BYTE *)plVar35,(BYTE *)plVar1);
            }
            else {
              lVar32 = plVar35[1];
              *plVar23 = *plVar35;
              plVar23[1] = lVar32;
            }
            psVar24 = seqStore->sequences;
            psVar24->litLength = 0;
            psVar24->offBase = 1;
            if (0xffff < sVar22 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar24->mlBase = (U16)(sVar22 + 1);
            seqStore->sequences = psVar24 + 1;
            pUVar11[(uint)((int)*plVar35 * -0x61c8864f) >> (bVar26 & 0x1f)] = UVar34;
            UVar34 = local_f0;
            local_f0 = local_ec;
          }
        }
        goto LAB_003cecc2;
      }
    }
  }
LAB_003cf3a6:
  *rep = local_f0;
  rep[1] = local_ec;
  return (long)iEnd - (long)src;
code_r0x003cdf26:
  plVar23 = plVar23 + (ulong)(plVar23 <= plVar35) * 0x20;
  uVar41 = (ulong)pUVar10[uVar43 >> 8];
  uVar45 = uVar43 ^ uVar41;
  plVar36 = plVar35;
  plVar35 = (long *)((long)plVar35 + uVar40);
  goto LAB_003cde54;
LAB_003cd924:
  UVar16 = (int)plVar36 - (int)piVar47;
  sVar22 = ZSTD_count((BYTE *)((long)plVar36 + 4),(BYTE *)(piVar47 + 1),iEnd);
  for (lVar32 = 0;
      ((plVar35 = (long *)(lVar32 + (long)plVar36), iStart < (BYTE *)((long)piVar47 + lVar32) &&
       (src < plVar35)) &&
      (*(BYTE *)((long)plVar36 + lVar32 + -1) == *(BYTE *)((long)piVar47 + lVar32 + -1)));
      lVar32 = lVar32 + -1) {
  }
  uVar40 = (long)plVar35 - (long)src;
  plVar23 = (long *)seqStore->lit;
  if (plVar1 < plVar35) {
LAB_003cdad0:
    ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)src,(BYTE *)plVar35,(BYTE *)plVar1);
  }
  else {
    lVar28 = *(long *)((long)src + 8);
    *plVar23 = *src;
    plVar23[1] = lVar28;
    pBVar20 = seqStore->lit;
    if (uVar40 < 0x11) {
LAB_003cdb96:
      seqStore->lit = pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src));
      psVar24 = seqStore->sequences;
      goto LAB_003cdbaa;
    }
    lVar28 = *(long *)((long)src + 0x18);
    *(long *)(pBVar20 + 0x10) = *(long *)((long)src + 0x10);
    *(long *)(pBVar20 + 0x18) = lVar28;
    if (0x20 < (long)uVar40) {
      lVar28 = 0;
      do {
        puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar14 = puVar2[1];
        pBVar27 = pBVar20 + lVar28 + 0x20;
        *(undefined8 *)pBVar27 = *puVar2;
        *(undefined8 *)(pBVar27 + 8) = uVar14;
        puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar14 = puVar2[1];
        *(undefined8 *)(pBVar27 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar27 + 0x18) = uVar14;
        lVar28 = lVar28 + 0x20;
      } while (pBVar27 + 0x20 < pBVar20 + (long)((long)plVar36 + (lVar32 - (long)src)));
    }
  }
LAB_003cdadd:
  seqStore->lit = seqStore->lit + (long)((long)plVar36 + (lVar32 - (long)src));
  psVar24 = seqStore->sequences;
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_003cdbaa:
  sVar22 = sVar22 - lVar32;
  psVar24->litLength = (short)lVar32 + ((short)plVar36 - (short)src);
  psVar24->offBase = UVar16 + 3;
  local_ec = local_f0;
  local_f0 = UVar16;
LAB_003cdbd7:
  if (0xffff < sVar22 + 1) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
  }
  plVar35 = (long *)(sVar22 + 4 + (long)plVar35);
  psVar24->mlBase = (U16)(sVar22 + 1);
  seqStore->sequences = psVar24 + 1;
  src = plVar35;
  if (plVar35 <= plVar18) {
    pUVar11[(ulong)(*(long *)(pBVar7 + ((long)plVar36 - (long)pBVar7 & 0xffffffffU) + 2) *
                   -0x30e4432340650000) >> (bVar26 & 0x3f)] = UVar34 + 2;
    pUVar11[(ulong)(*(long *)((long)plVar35 + -2) * -0x30e4432340650000) >> (bVar26 & 0x3f)] =
         ((int)plVar35 + -2) - iVar46;
    UVar34 = local_ec;
    for (; local_ec = UVar34, src = plVar35, plVar35 <= plVar18;
        plVar35 = (long *)((long)plVar35 + sVar22 + 4)) {
      UVar34 = (int)plVar35 - iVar46;
      uVar17 = UVar34 - local_ec;
      pBVar20 = pBVar7;
      if (uVar17 < uVar3) {
        pBVar20 = pBVar9 + -uVar19;
      }
      if (((uVar3 - 1) - uVar17 < 3) || (*(int *)(pBVar20 + uVar17) != (int)*plVar35)) break;
      pBVar27 = iEnd;
      if (uVar17 < uVar3) {
        pBVar27 = mEnd;
      }
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar35 + 4),(BYTE *)((long)(pBVar20 + uVar17) + 4),iEnd,
                          pBVar27,iStart);
      plVar23 = (long *)seqStore->lit;
      if (plVar1 < plVar35) {
        ZSTD_safecopyLiterals((BYTE *)plVar23,(BYTE *)plVar35,(BYTE *)plVar35,(BYTE *)plVar1);
      }
      else {
        lVar32 = plVar35[1];
        *plVar23 = *plVar35;
        plVar23[1] = lVar32;
      }
      psVar24 = seqStore->sequences;
      psVar24->litLength = 0;
      psVar24->offBase = 1;
      if (0xffff < sVar22 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar24->mlBase = (U16)(sVar22 + 1);
      seqStore->sequences = psVar24 + 1;
      pUVar11[(ulong)(*plVar35 * -0x30e4432340650000) >> (bVar26 & 0x3f)] = UVar34;
      UVar34 = local_f0;
      local_f0 = local_ec;
    }
  }
  goto LAB_003cd74b;
code_r0x003cedcd:
  plVar23 = plVar23 + (ulong)(plVar23 <= plVar35) * 0x20;
  uVar17 = pUVar10[uVar42 >> 8];
  uVar44 = uVar42 ^ uVar17;
  plVar36 = plVar35;
  plVar35 = (long *)((long)plVar35 + uVar40);
  goto LAB_003ced09;
code_r0x003ce6a1:
  plVar23 = plVar23 + (ulong)(plVar23 <= plVar35) * 0x20;
  uVar41 = (ulong)pUVar10[uVar43 >> 8];
  uVar45 = uVar43 ^ uVar41;
  plVar36 = plVar35;
  plVar35 = (long *)((long)plVar35 + uVar40);
  goto LAB_003ce5d4;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}